

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserPafTest_ParseInChunks_Test::~BioparserPafTest_ParseInChunks_Test
          (BioparserPafTest_ParseInChunks_Test *this)

{
  BioparserPafTest::~BioparserPafTest(&this->super_BioparserPafTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserPafTest, ParseInChunks) {
  Setup("sample.paf");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}